

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::permute<int>(Omega_h *this,Read<int> *a_data,LOs *a2b,Int width)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  Read<int> RVar3;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> b_data;
  ScopedTimer local_ea;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Write<int> local_c8;
  Write<int> local_b8;
  Write<int> local_a8;
  Write<int> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_e9);
  std::operator+(&local_e8,&local_68,":");
  std::__cxx11::to_string(&local_48,0x84);
  std::operator+(&local_88,&local_e8,&local_48);
  begin_code("permute",local_88._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_88,"",(allocator *)&local_68);
  Write<int>::Write((Write<int> *)&local_e8,(int)(sVar2 >> 2) * width,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  Write<int>::Write(&local_98,&a_data->write_);
  Write<int>::Write(&local_a8,&a2b->write_);
  Write<int>::Write(&local_b8,(Write<int> *)&local_e8);
  map_into<int>((Read<int> *)&local_98,(LOs *)&local_a8,&local_b8,width);
  Write<int>::~Write(&local_b8);
  Write<int>::~Write(&local_a8);
  Write<int>::~Write(&local_98);
  Write<int>::Write(&local_c8,(Write<int> *)&local_e8);
  Read<int>::Read((Read<signed_char> *)this,&local_c8);
  Write<int>::~Write(&local_c8);
  Write<int>::~Write((Write<int> *)&local_e8);
  ScopedTimer::~ScopedTimer(&local_ea);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> permute(Read<T> a_data, LOs a2b, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto nb = a2b.size();
  Write<T> b_data(nb * width);
  map_into(a_data, a2b, b_data, width);
  return b_data;
}